

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

MESH_PARAMETER_ID ON_MeshParameters::MeshParameterIdFromUnsigned(uint mesh_parameter_id_as_unsigned)

{
  MESH_PARAMETER_ID local_c;
  uint mesh_parameter_id_as_unsigned_local;
  
  switch(mesh_parameter_id_as_unsigned) {
  case 0:
    local_c = unspecified_mesh_parameter_id;
    break;
  case 1:
    local_c = bComputeCurvature_parameter_id;
    break;
  case 2:
    local_c = bSimplePlanes_parameter_id;
    break;
  case 3:
    local_c = bRefine_parameter_id;
    break;
  case 4:
    local_c = bJaggedSeams_parameter_id;
    break;
  case 5:
    local_c = bDoublePrecision_parameter_id;
    break;
  case 6:
    local_c = mesher_parameter_id;
    break;
  case 7:
    local_c = texture_range_parameter_id;
    break;
  case 8:
    local_c = tolerance_parameter_id;
    break;
  case 9:
    local_c = relative_tolerance_parameter_id;
    break;
  case 10:
    local_c = min_tolerance_parameter_id;
    break;
  case 0xb:
    local_c = min_edge_length_parameter_id;
    break;
  case 0xc:
    local_c = max_edge_length_parameter_id;
    break;
  case 0xd:
    local_c = grid_aspect_ratio_parameter_id;
    break;
  case 0xe:
    local_c = grid_min_count_parameter_id;
    break;
  case 0xf:
    local_c = grid_max_count_parameter_id;
    break;
  case 0x10:
    local_c = grid_angle_parameter_id;
    break;
  case 0x11:
    local_c = grid_amplification_parameter_id;
    break;
  case 0x12:
    local_c = refine_angle_parameter_id;
    break;
  case 0x13:
    local_c = face_type_parameter_id;
    break;
  case 0x14:
    local_c = srf_domain_parameter_id;
    break;
  case 0x15:
    local_c = bClosedObjectPostProcess_id;
    break;
  case 0x16:
    local_c = mesher_id;
    break;
  case 0x17:
    local_c = crv_tess_min_num_segments_parameter_id;
    break;
  case 0x18:
    local_c = crv_tess_angle_tol_in_degrees_parameter_id;
    break;
  case 0x19:
    local_c = crv_tess_max_dist_between_points_parameter_id;
    break;
  case 0x1a:
    local_c = crv_tess_min_parametric_ratio_parameter_id;
    break;
  case 0x1b:
    local_c = bEvaluatorBasedTessellation_parameter_id;
    break;
  case 0x1c:
    local_c = srf_tess_chord_height_parameter_id;
    break;
  case 0x1d:
    local_c = srf_tess_angle_tol_in_degrees_parameter_id;
    break;
  case 0x1e:
    local_c = srf_tess_max_edge_length_parameter_id;
    break;
  case 0x1f:
    local_c = srf_tess_min_edge_length_parameter_id;
    break;
  case 0x20:
    local_c = srf_tess_min_edge_length_ratio_uv_parameter_id;
    break;
  case 0x21:
    local_c = srf_tess_max_aspect_ratio_parameter_id;
    break;
  case 0x22:
    local_c = smoothing_passes_parameter_id;
    break;
  case 0x23:
    local_c = max_mesh_parameter_id;
    break;
  default:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
               ,0x1a8d,"","Invalid mesh_parameter_id_as_unsigned parameter");
    local_c = unspecified_mesh_parameter_id;
  }
  return local_c;
}

Assistant:

ON_MeshParameters::MESH_PARAMETER_ID ON_MeshParameters::MeshParameterIdFromUnsigned(
  unsigned int mesh_parameter_id_as_unsigned
)
{
  switch (mesh_parameter_id_as_unsigned)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::unspecified_mesh_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::bComputeCurvature_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::bSimplePlanes_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::bRefine_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::bJaggedSeams_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::bDoublePrecision_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::mesher_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::texture_range_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::tolerance_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::relative_tolerance_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::min_tolerance_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::min_edge_length_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::max_edge_length_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::grid_aspect_ratio_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::grid_min_count_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::grid_max_count_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::grid_angle_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::grid_amplification_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::refine_angle_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::face_type_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::srf_domain_parameter_id);

  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::bClosedObjectPostProcess_id);

  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::mesher_id);

  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::crv_tess_min_num_segments_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::crv_tess_angle_tol_in_degrees_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::crv_tess_max_dist_between_points_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::crv_tess_min_parametric_ratio_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::bEvaluatorBasedTessellation_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::srf_tess_chord_height_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::srf_tess_angle_tol_in_degrees_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::srf_tess_max_edge_length_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::srf_tess_min_edge_length_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::srf_tess_min_edge_length_ratio_uv_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::srf_tess_max_aspect_ratio_parameter_id);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::smoothing_passes_parameter_id);
  
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_PARAMETER_ID::max_mesh_parameter_id);
  }
  
  ON_ERROR("Invalid mesh_parameter_id_as_unsigned parameter");
  return ON_MeshParameters::MESH_PARAMETER_ID::unspecified_mesh_parameter_id;

}